

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O3

bool __thiscall
slang::ast::Type::isValidForRand(Type *this,RandMode mode,LanguageVersion languageVersion)

{
  bool bVar1;
  
  while( true ) {
    bVar1 = isIntegral(this);
    if (((bVar1) || (bVar1 = isNull(this), bVar1)) && (bVar1 = isTaggedUnion(this), !bVar1)) {
      return true;
    }
    bVar1 = isFloating(this);
    if (bVar1) {
      return 0 < (int)languageVersion && mode == Rand;
    }
    bVar1 = isArray(this);
    if (!bVar1) break;
    this = getArrayElementType(this);
  }
  bVar1 = isClass(this);
  if ((!bVar1) && (bVar1 = isUnpackedStruct(this), !bVar1)) {
    return false;
  }
  return mode == Rand;
}

Assistant:

bool Type::isValidForRand(RandMode mode, LanguageVersion languageVersion) const {
    if ((isIntegral() || isNull()) && !isTaggedUnion())
        return true;

    if (isFloating())
        return mode == RandMode::Rand && languageVersion >= LanguageVersion::v1800_2023;

    if (isArray())
        return getArrayElementType()->isValidForRand(mode, languageVersion);

    if (isClass() || isUnpackedStruct())
        return mode == RandMode::Rand;

    return false;
}